

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlst.cpp
# Opt level: O0

int CVmObjList::getp_car(vm_val_t *retval,vm_val_t *self_val,char *lst,uint *argc)

{
  int iVar1;
  size_t sVar2;
  vm_val_t *in_RCX;
  vm_val_t *in_RDI;
  vm_val_t *in_stack_ffffffffffffffc8;
  uint *in_stack_ffffffffffffffd0;
  
  if ((getp_car(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_car(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::
                                   desc), iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_car::desc,0);
    __cxa_guard_release(&getp_car(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    (in_RCX,in_stack_ffffffffffffffd0,(CVmNativeCodeDesc *)in_stack_ffffffffffffffc8
                    );
  if (iVar1 == 0) {
    sVar2 = vmb_get_len((char *)0x36d0b9);
    if (sVar2 == 0) {
      vm_val_t::set_nil(in_RDI);
    }
    else {
      vmb_get_dh((char *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    }
  }
  return 1;
}

Assistant:

int CVmObjList::getp_car(VMG_ vm_val_t *retval, const vm_val_t *self_val,
                         const char *lst, uint *argc)
{
    static CVmNativeCodeDesc desc(0);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* 
     *   if the list has at least one element, return it; otherwise return
     *   nil 
     */
    if (vmb_get_len(lst) == 0)
    {
        /* no elements - return nil */
        retval->set_nil();
    }
    else
    {
        /* it has at least one element - return the first element */
        vmb_get_dh(lst + VMB_LEN, retval);
    }

    /* handled */
    return TRUE;
}